

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  byte bVar1;
  Extension *pEVar2;
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    bVar1 = 0;
  }
  else {
    if (pEVar2->is_repeated == true) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0xef);
      other = LogMessage::operator<<(&local_58,"CHECK failed: !ext->is_repeated: ");
      LogFinisher::operator=(&local_19,other);
      LogMessage::~LogMessage(&local_58);
    }
    bVar1 = pEVar2->field_0xa ^ 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ExtensionSet::Has(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == NULL) return false;
  GOOGLE_DCHECK(!ext->is_repeated);
  return !ext->is_cleared;
}